

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

shared_ptr<embree::Texture> __thiscall
embree::XMLLoader::loadTextureParm(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *pXVar1;
  bool bVar2;
  uint height;
  Format format;
  uint uVar3;
  iterator iVar4;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long lVar6;
  Texture *this_00;
  ulong uVar7;
  runtime_error *prVar8;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint uVar9;
  shared_ptr<embree::Texture> sVar10;
  allocator local_c1;
  XMLLoader *local_c0;
  string local_b8;
  undefined1 local_98 [36];
  uint local_74;
  FileName src;
  string id;
  
  pXVar1 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&src,"id",(allocator *)&local_b8);
  XML::parm(&id,pXVar1,&src.filename);
  std::__cxx11::string::~string((string *)&src);
  bVar2 = std::operator!=(&id,"");
  if (bVar2) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                    *)&((xml[10].ptr)->children).
                       super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&id);
    if (iVar4._M_node != (_Base_ptr)&(xml[10].ptr)->body) {
      p_Var5 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                              *)&((xml[10].ptr)->children).
                                 super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&id)->
                super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var5);
      goto LAB_0017005e;
    }
  }
  (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  (this->path).filename._M_string_length = 0;
  pXVar1 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)local_98,"src",&local_c1);
  XML::parm(&local_b8,pXVar1,(string *)local_98);
  FileName::FileName(&src,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string((string *)&local_b8,(string *)&src);
  bVar2 = std::operator!=(&local_b8,"");
  std::__cxx11::string::~string((string *)&local_b8);
  if (bVar2) {
    FileName::operator+((FileName *)&local_b8,(FileName *)xml,&src);
    Texture::load((Texture *)local_98,(FileName *)&local_b8);
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    pXVar1 = (XML *)*in_RDX;
    local_c0 = this;
    std::__cxx11::string::string((string *)local_98,"width",&local_c1);
    XML::parm(&local_b8,pXVar1,(string *)local_98);
    local_74 = std::__cxx11::stoi(&local_b8,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)local_98);
    pXVar1 = (XML *)*in_RDX;
    std::__cxx11::string::string((string *)local_98,"height",&local_c1);
    XML::parm(&local_b8,pXVar1,(string *)local_98);
    height = std::__cxx11::stoi(&local_b8,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)local_98);
    pXVar1 = (XML *)*in_RDX;
    std::__cxx11::string::string((string *)local_98,"format",&local_c1);
    XML::parm(&local_b8,pXVar1,(string *)local_98);
    format = Texture::string_to_format(&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)local_98);
    uVar3 = Texture::getFormatBytesPerTexel(format);
    lVar6 = ftell((FILE *)xml[4].ptr);
    uVar9 = height * local_74;
    if ((long)(ulong)*(uint *)&xml[9].ptr < (long)((ulong)(uVar3 * uVar9) + lVar6)) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)local_98,(string *)(xml + 5));
      std::operator+(&local_b8,"error reading from binary file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      std::runtime_error::runtime_error(prVar8,(string *)&local_b8);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = (Texture *)Texture::operator_new(0x40);
    Texture::Texture(this_00,local_74,height,format,(char *)0x0);
    std::__shared_ptr<embree::Texture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<embree::Texture,void>
              ((__shared_ptr<embree::Texture,(__gnu_cxx::_Lock_policy)2> *)&local_b8,this_00);
    this = local_c0;
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_c0,
               (__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length);
    uVar7 = __fread_chk(*(undefined8 *)((this->path).filename._M_dataplus._M_p + 0x18),
                        0xffffffffffffffff,uVar3,(ulong)uVar9,xml[4].ptr);
    if (uVar7 != uVar9) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)local_98,(string *)(xml + 5));
      std::operator+(&local_b8,"error reading from binary file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      std::runtime_error::runtime_error(prVar8,(string *)&local_b8);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  bVar2 = std::operator!=(&id,"");
  if (bVar2) {
    p_Var5 = &std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                            *)&((xml[10].ptr)->children).
                               super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&id)->
              super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
              (p_Var5,(__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)this);
  }
  std::__cxx11::string::~string((string *)&src);
LAB_0017005e:
  std::__cxx11::string::~string((string *)&id);
  sVar10.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar10.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<embree::Texture>)
         sVar10.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> XMLLoader::loadTextureParm(const Ref<XML>& xml)
  {
    const std::string id = xml->parm("id");
    if (id != "" && state.textureMap.find(id) != state.textureMap.end())
      return state.textureMap[id];

    std::shared_ptr<Texture> texture;
    const FileName src = xml->parm("src");

    /*! load texture from file */
    if (src.str() != "") {
      texture = Texture::load(path+src);
    }

    /*! load texture from binary file */
    else {
      const unsigned width  = stoi(xml->parm("width"));
      const unsigned height = stoi(xml->parm("height"));
      const Texture::Format format = Texture::string_to_format(xml->parm("format"));
      const unsigned bytesPerTexel = Texture::getFormatBytesPerTexel(format);
      if (ftell(binFile) + width*height*bytesPerTexel > (unsigned)binFileSize)
        THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());
      
      //texture = std::make_shared<Texture>(width,height,format);
      texture = std::shared_ptr<Texture>(new Texture(width,height,format));
      if (width*height != fread(texture->data, bytesPerTexel, width*height, binFile)) 
        THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());
    }
    
    if (id != "") state.textureMap[id] = texture;
    return texture;
  }